

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QFileSystemEntry *
QFileSystemEngine::getLinkTarget
          (QFileSystemEntry *__return_storage_ptr__,QFileSystemEntry *link,QFileSystemMetaData *data
          )

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  int *piVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_f0;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char> local_b8;
  QFileSystemEntry local_98;
  QDir parent;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = QFileSystemEntry::isEmpty(link);
  if ((bVar5) || (bVar5 = qIsFilenameBroken(link), bVar5)) {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,link);
      return __return_storage_ptr__;
    }
  }
  else {
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::nativeFilePath((NativePath *)&local_98,link);
    pcVar7 = (char *)local_98.m_filePath.d.ptr;
    if (local_98.m_filePath.d.ptr == (char16_t *)0x0) {
      pcVar7 = "";
    }
    qt_readlink((QByteArray *)&local_b8,pcVar7);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    if ((undefined1 *)local_b8.size == (undefined1 *)0x0) {
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__);
    }
    else {
      local_d8.size = 0;
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (char16_t *)0x0;
      if (((data->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x40000) == 0) {
        fillMetaData(link,data,(MetaDataFlags)0x40000);
      }
      if ((((data->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x40000) != 0) &&
         (pcVar7 = QByteArray::data((QByteArray *)&local_b8), *pcVar7 != '/')) {
        parent.d_ptr.d.ptr = (QSharedDataPointer<QDirPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QFileSystemEntry::filePath(&local_98.m_filePath,link);
        QDir::QDir(&parent,&local_98.m_filePath);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QDir::cdUp(&parent);
        QDir::path(&local_98.m_filePath,&parent);
        qVar4 = local_d8.size;
        pcVar3 = local_d8.ptr;
        pDVar2 = local_d8.d;
        local_d8.d = local_98.m_filePath.d.d;
        local_d8.ptr = local_98.m_filePath.d.ptr;
        local_98.m_filePath.d.d = pDVar2;
        local_98.m_filePath.d.ptr = pcVar3;
        local_d8.size = local_98.m_filePath.d.size;
        local_98.m_filePath.d.size = qVar4;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        if ((local_d8.size != 0) &&
           (bVar5 = QString::endsWith((QString *)&local_d8,(QChar)0x2f,CaseSensitive), !bVar5)) {
          QString::append((QString *)&local_d8,(QChar)0x2f);
        }
        QDir::~QDir(&parent);
      }
      QString::fromLocal8Bit<void>(&local_98.m_filePath,(QByteArray *)&local_b8);
      QString::append((QString *)&local_d8,&local_98.m_filePath);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      bVar5 = QString::startsWith((QString *)&local_d8,(QChar)0x2f,CaseSensitive);
      if (!bVar5) {
        absoluteName(&local_98,link);
        QFileSystemEntry::path((QString *)&local_108,&local_98);
        parent.d_ptr.d.ptr =
             (QSharedDataPointer<QDirPrivate>)(QSharedDataPointer<QDirPrivate>)local_108.d;
        local_108.d = (Data *)0x0;
        local_108.ptr = (char16_t *)0x0;
        local_108.size = 0;
        QStringBuilder<QString,_char16_t>::convertTo<QString>
                  ((QString *)&local_f0,(QStringBuilder<QString,_char16_t> *)&parent);
        QString::prepend((QString *)&local_d8,(QString *)&local_f0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parent);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
        QFileSystemEntry::~QFileSystemEntry(&local_98);
      }
      QDir::cleanPath(&local_98.m_filePath,(QString *)&local_d8);
      qVar4 = local_d8.size;
      pcVar3 = local_d8.ptr;
      pDVar2 = local_d8.d;
      local_d8.d = local_98.m_filePath.d.d;
      local_d8.ptr = local_98.m_filePath.d.ptr;
      local_98.m_filePath.d.d = pDVar2;
      local_98.m_filePath.d.ptr = pcVar3;
      local_d8.size = local_98.m_filePath.d.size;
      local_98.m_filePath.d.size = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      if ((1 < (ulong)local_d8.size) &&
         (bVar5 = QString::endsWith((QString *)&local_d8,(QChar)0x2f,CaseSensitive), bVar5)) {
        QString::chop((QString *)&local_d8,1);
      }
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,(QString *)&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::getLinkTarget(const QFileSystemEntry &link, QFileSystemMetaData &data)
{
    Q_CHECK_FILE_NAME(link, link);

    QByteArray s = qt_readlink(link.nativeFilePath().constData());
    if (s.size() > 0) {
        QString ret;
        if (!data.hasFlags(QFileSystemMetaData::DirectoryType))
            fillMetaData(link, data, QFileSystemMetaData::DirectoryType);
        if (data.isDirectory() && s[0] != '/') {
            QDir parent(link.filePath());
            parent.cdUp();
            ret = parent.path();
            if (!ret.isEmpty() && !ret.endsWith(u'/'))
                ret += u'/';
        }
        ret += QFile::decodeName(s);

        if (!ret.startsWith(u'/'))
            ret.prepend(absoluteName(link).path() + u'/');
        ret = QDir::cleanPath(ret);
        if (ret.size() > 1 && ret.endsWith(u'/'))
            ret.chop(1);
        return QFileSystemEntry(ret);
    }
#if defined(Q_OS_DARWIN)
    {
        QCFString path = CFStringCreateWithFileSystemRepresentation(0,
            QFile::encodeName(QDir::cleanPath(link.filePath())).data());
        if (!path)
            return QFileSystemEntry();

        QCFType<CFURLRef> url = CFURLCreateWithFileSystemPath(0, path, kCFURLPOSIXPathStyle,
            data.hasFlags(QFileSystemMetaData::DirectoryType));
        if (!url)
            return QFileSystemEntry();

        QCFType<CFDataRef> bookmarkData = CFURLCreateBookmarkDataFromFile(0, url, NULL);
        if (!bookmarkData)
            return QFileSystemEntry();

        QCFType<CFURLRef> resolvedUrl = CFURLCreateByResolvingBookmarkData(0,
            bookmarkData,
            (CFURLBookmarkResolutionOptions)(kCFBookmarkResolutionWithoutUIMask
                | kCFBookmarkResolutionWithoutMountingMask), NULL, NULL, NULL, NULL);
        if (!resolvedUrl)
            return QFileSystemEntry();

        QCFString cfstr(CFURLCopyFileSystemPath(resolvedUrl, kCFURLPOSIXPathStyle));
        if (!cfstr)
            return QFileSystemEntry();

        return QFileSystemEntry(QString::fromCFString(cfstr));
    }
#endif
    return QFileSystemEntry();
}